

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.cpp
# Opt level: O1

size_t __thiscall groundupdbext::HighwayHash::operator()(HighwayHash *this,Bytes *data)

{
  HighwayHashCatT<1U> *pHVar1;
  size_t __n;
  pointer __src;
  int i;
  long lVar2;
  ulong __n_00;
  HHStateT<1U> *pHVar3;
  HHStatePortable *pHVar4;
  pointer __src_00;
  ulong __n_01;
  byte bVar5;
  HHPacket tmp;
  Lanes rotated_keys;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  HHStatePortable local_e0;
  
  bVar5 = 0;
  pHVar1 = this->m_hh;
  lVar2 = 0;
  do {
    local_e0.v0[lVar2] = this->m_key[lVar2] << 0x20 | this->m_key[lVar2] >> 0x20;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  (pHVar1->state_).mul0[2] = 0x13198a2e03707344;
  (pHVar1->state_).mul0[3] = 0x243f6a8885a308d3;
  (pHVar1->state_).mul0[0] = 0xdbe6d5d5fe4cce2f;
  (pHVar1->state_).mul0[1] = 0xa4093822299f31d0;
  (pHVar1->state_).mul1[0] = 0x3bd39e10cb0ef593;
  (pHVar1->state_).mul1[1] = 0xc0acf169b5f18a8c;
  (pHVar1->state_).mul1[2] = 0xbe5466cf34e90c6c;
  (pHVar1->state_).mul1[3] = 0x452821e638d01377;
  lVar2 = 0;
  do {
    *(ulong *)((long)(pHVar1->state_).v0 + lVar2) =
         *(ulong *)((long)this->m_key + lVar2) ^
         *(ulong *)((long)&highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::
                           init0 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  lVar2 = 0;
  do {
    *(ulong *)((long)(pHVar1->state_).v1 + lVar2) =
         *(ulong *)((long)local_e0.v0 + lVar2) ^
         *(ulong *)((long)&highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::
                           init1 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  pHVar1->buffer_usage_ = 0;
  __src_00 = (data->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if (__src_00 !=
      (data->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pHVar1 = this->m_hh;
      __n = pHVar1->buffer_usage_;
      __n_01 = 0x20 - __n;
      if (__n_01 < 2) {
        pHVar3 = &pHVar1->state_;
        pHVar4 = &local_e0;
        for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
          pHVar4->v0[0] = pHVar3->v0[0];
          pHVar3 = (HHStateT<1U> *)((long)pHVar3 + (ulong)bVar5 * -0x10 + 8);
          pHVar4 = (HHStatePortable *)((long)pHVar4 + (ulong)bVar5 * -0x10 + 8);
        }
        if (__n == 0) {
          __n_00 = 1;
          __src = __src_00;
        }
        else {
          memcpy(&local_100,pHVar1,__n);
          if (__n != 0x20) {
            memcpy((void *)((long)&local_100 + __n),__src_00,__n_01);
          }
          local_110 = local_f0;
          uStack_108 = uStack_e8;
          local_120 = local_100;
          uStack_118 = uStack_f8;
          highwayhash::Portable::HHStatePortable::Update(&local_e0,(Lanes *)&local_120);
          __n_00 = __n - 0x1f;
          __src = __src_00 + __n_01;
        }
        for (; 0x1f < __n_00; __n_00 = __n_00 - 0x20) {
          local_120 = *(undefined8 *)__src;
          uStack_118 = *(undefined8 *)(__src + 8);
          local_110 = *(undefined8 *)(__src + 0x10);
          uStack_108 = *(undefined8 *)(__src + 0x18);
          highwayhash::Portable::HHStatePortable::Update(&local_e0,(Lanes *)&local_120);
          __src = __src + 0x20;
        }
        pHVar1->buffer_usage_ = __n_00;
        pHVar4 = &local_e0;
        pHVar3 = &pHVar1->state_;
        for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
          pHVar3->v0[0] = pHVar4->v0[0];
          pHVar4 = (HHStatePortable *)((long)pHVar4 + (ulong)bVar5 * -0x10 + 8);
          pHVar3 = (HHStateT<1U> *)((long)pHVar3 + (ulong)bVar5 * -0x10 + 8);
        }
        if (__n_00 != 0) {
          memcpy(pHVar1,__src,__n_00);
        }
      }
      else {
        pHVar1->buffer_[__n] = *__src_00;
        pHVar1->buffer_usage_ = pHVar1->buffer_usage_ + 1;
      }
      __src_00 = __src_00 + 1;
    } while (__src_00 !=
             (data->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>(this->m_hh,this->m_result);
  return *this->m_result;
}

Assistant:

std::size_t
HighwayHash::operator() (const groundupdb::Bytes& data) const noexcept {
  m_hh->Reset(m_key);
  for (auto iter = data.begin();iter != data.end();++iter) {
    m_hh->Append((const char*)&*iter,sizeof(*iter));
  }
  m_hh->Finalize(m_result);
  return *m_result;
}